

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTransformedLp.cpp
# Opt level: O1

bool __thiscall
HighsTransformedLp::transform
          (HighsTransformedLp *this,vector<double,_std::allocator<double>_> *vals,
          vector<double,_std::allocator<double>_> *upper,
          vector<double,_std::allocator<double>_> *solval,vector<int,_std::allocator<int>_> *inds,
          double *rhs,bool *integersPositive,bool preferVbds)

{
  HighsSparseVectorSum *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  double *pdVar1;
  BoundType BVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer ppVar6;
  _Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_> _Var7;
  pointer pHVar8;
  HighsOptions *pHVar9;
  HighsMipSolver *pHVar10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  pointer pBVar14;
  pointer pdVar15;
  vector<double,_std::allocator<double>_> *pvVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  double dVar20;
  ulong uVar21;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined8 uVar25;
  double dVar26;
  undefined8 uVar27;
  bool infeasible_1;
  bool redundant_1;
  bool infeasible;
  bool redundant;
  double local_c8;
  double local_b8;
  bool local_a4;
  bool local_a3;
  bool local_a2;
  bool local_a1;
  HighsMipSolver *local_a0;
  vector<double,_std::allocator<double>_> *local_98;
  undefined8 uStack_90;
  double local_88;
  double local_70;
  vector<double,_std::allocator<double>_> *local_68;
  undefined8 uStack_60;
  HighsSparseVectorSum *local_50;
  vector<double,_std::allocator<double>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  double *local_38;
  
  local_c8 = *rhs;
  local_a0 = this->lprelaxation->mipsolver;
  iVar3 = (this->lprelaxation->lpsolver).model_.lp_.num_col_;
  dVar20 = (double)((ulong)((long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
  local_48 = solval;
  local_40 = upper;
  local_38 = rhs;
  if (SUB84(dVar20,0) < 1) {
    local_b8 = 0.0;
  }
  else {
    local_50 = &this->vectorsum;
    iVar17 = 0;
    local_b8 = 0.0;
    do {
      iVar4 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start[iVar17];
      lVar18 = (long)iVar4;
      local_88 = (double)CONCAT44(local_88._4_4_,iVar17);
      if (iVar4 < iVar3) {
        dVar26 = *(double *)
                  (*(long *)((long)(local_a0->mipdata_)._M_t.
                                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                   .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x6b0) +
                  lVar18 * 8);
        uVar27 = 0;
        pvVar16 = (vector<double,_std::allocator<double>_> *)
                  *(double *)
                   (*(long *)((long)(local_a0->mipdata_)._M_t.
                                    super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                    .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x698) +
                   lVar18 * 8);
        uVar25 = 0;
      }
      else {
        local_98 = (vector<double,_std::allocator<double>_> *)
                   HighsLpRelaxation::slackLower(this->lprelaxation,iVar4 - iVar3);
        uStack_90 = extraout_XMM0_Qb;
        dVar26 = HighsLpRelaxation::slackUpper(this->lprelaxation,iVar4 - iVar3);
        pvVar16 = local_98;
        uVar25 = uStack_90;
        uVar27 = extraout_XMM0_Qb_00;
      }
      dVar22 = dVar26 - (double)pvVar16;
      iVar13 = SUB84(dVar20,0);
      if (dVar22 < (local_a0->options_mip_->super_HighsOptionsStruct).small_matrix_value) {
        if ((double)pvVar16 <= dVar26) {
          dVar26 = (double)pvVar16;
        }
        pdVar15 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        dVar26 = dVar26 * pdVar15[iVar17];
        dVar22 = local_c8 - dVar26;
        dVar20 = (local_c8 - (dVar26 + dVar22)) + (-dVar26 - (dVar22 - (dVar26 + dVar22)));
        piVar5 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar5[iVar17] = piVar5[(long)iVar13 + -1];
        pdVar15[iVar17] = pdVar15[(long)iVar13 + -1];
        piVar5[(long)iVar13 + -1] = 0;
        pdVar15[(long)iVar13 + -1] = 0.0;
LAB_002f4a02:
        local_b8 = local_b8 + dVar20;
        dVar20 = (double)(ulong)(iVar13 - 1);
        bVar11 = false;
        local_c8 = dVar22;
LAB_002f4a39:
        iVar17 = local_88._0_4_;
      }
      else {
        if (((double)pvVar16 <= -INFINITY) && (INFINITY <= dVar26)) {
          HighsSparseVectorSum::clear(local_50);
          bVar11 = true;
          goto LAB_002f4a39;
        }
        ppVar6 = (this->bestVub).
                 super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_98 = pvVar16;
        uStack_90 = uVar25;
        local_70 = dVar22;
        local_68 = (vector<double,_std::allocator<double>_> *)dVar26;
        uStack_60 = uVar27;
        if (ppVar6[lVar18].first != -1) {
          dVar22 = ppVar6[lVar18].second.constant;
          dVar24 = ppVar6[lVar18].second.coef;
          dVar23 = 0.0;
          if (0.0 <= dVar24) {
            dVar23 = dVar24;
          }
          dVar24 = dVar22 + dVar23;
          _Var7.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl =
               (local_a0->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>;
          if (*(double *)
               ((long)_Var7.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl + 0x6620
               ) + dVar26 <
              (dVar23 - (dVar24 - dVar22)) + (dVar22 - (dVar24 - (dVar24 - dVar22))) + 0.0 + dVar24)
          {
            local_a1 = false;
            local_a2 = false;
            HighsImplications::cleanupVub
                      ((HighsImplications *)
                       ((long)_Var7.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl
                       + 0x5dd0),iVar4,ppVar6[lVar18].first,&ppVar6[lVar18].second,dVar26,&local_a1,
                       &local_a2,false);
          }
        }
        ppVar6 = (this->bestVlb).
                 super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (ppVar6[lVar18].first != -1) {
          dVar26 = ppVar6[lVar18].second.constant;
          dVar22 = ppVar6[lVar18].second.coef;
          dVar24 = 0.0;
          if (dVar22 <= 0.0) {
            dVar24 = dVar22;
          }
          dVar22 = dVar26 + dVar24;
          _Var7.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl =
               (local_a0->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>;
          if ((dVar24 - (dVar22 - dVar26)) + (dVar26 - (dVar22 - (dVar22 - dVar26))) + 0.0 + dVar22
              < (double)local_98 -
                *(double *)
                 ((long)_Var7.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl +
                 0x6620)) {
            local_a3 = false;
            local_a4 = false;
            HighsImplications::cleanupVlb
                      ((HighsImplications *)
                       ((long)_Var7.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl
                       + 0x5dd0),iVar4,ppVar6[lVar18].first,&ppVar6[lVar18].second,(double)local_98,
                       &local_a3,&local_a4,false);
          }
        }
        BVar2 = (this->boundTypes).
                super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar18];
        bVar11 = HighsLpRelaxation::isColIntegral(this->lprelaxation,iVar4);
        if (bVar11) {
          if (((((1.5 < local_70) &&
                (dVar26 = (this->boundDist).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar18], dVar26 == 0.0)) &&
               (!NAN(dVar26))) &&
              ((dVar26 = (this->simpleLbDist).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar18], dVar26 != 0.0 ||
               (NAN(dVar26))))) &&
             ((dVar26 = (this->simpleUbDist).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar18], dVar26 != 0.0 ||
              (NAN(dVar26))))) {
            if ((this->bestVlb).
                super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar18].first != -1) {
              dVar26 = (this->ubDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar18];
              dVar22 = (this->lbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar18];
              dVar24 = *(double *)
                        ((long)(local_a0->mipdata_)._M_t.
                               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                               .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x6620);
              if (dVar22 - dVar24 <= dVar26) {
                if ((dVar22 < dVar26 - dVar24) ||
                   ((this->bestVub).
                    super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar18].first == -1))
                goto LAB_002f4d10;
                pBVar14 = (this->boundTypes).
                          super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (0.0 < (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[iVar17]) goto LAB_002f4d81;
                goto LAB_002f4d17;
              }
            }
            (this->boundTypes).
            super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar18] = kVariableUb;
            goto LAB_002f4e5b;
          }
          dVar26 = (this->simpleLbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar18];
          dVar22 = (this->simpleUbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar18];
          dVar24 = *(double *)
                    ((long)(local_a0->mipdata_)._M_t.
                           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                           .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x6620);
          if (dVar22 - dVar24 <= dVar26) {
            if (dVar26 - dVar24 <= dVar22) {
              pBVar14 = (this->boundTypes).
                        super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (0.0 < (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[iVar17]) {
                pBVar14[lVar18] = kSimpleLb;
                goto LAB_002f4e0f;
              }
            }
            else {
              pBVar14 = (this->boundTypes).
                        super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            pBVar14[lVar18] = kSimpleUb;
          }
          else {
            (this->boundTypes).
            super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar18] = kSimpleLb;
          }
LAB_002f4e0f:
          iVar17 = local_88._0_4_ + 1;
          bVar11 = false;
        }
        else {
          dVar26 = (this->lbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar18];
          dVar22 = (this->ubDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar18];
          dVar24 = *(double *)
                    ((long)(local_a0->mipdata_)._M_t.
                           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                           .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x6620);
          if (dVar22 - dVar24 <= dVar26) {
            if (dVar22 < dVar26 - dVar24) {
              if (((this->bestVub).
                   super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar18].first == -1) ||
                 (((!preferVbds &&
                   (pdVar1 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + iVar17,
                   0.0 < *pdVar1 || *pdVar1 == 0.0)) &&
                  ((this->simpleUbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar18] <= dVar22 + dVar24)))) {
                (this->boundTypes).
                super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar18] = kSimpleUb;
              }
              else {
                pBVar14 = (this->boundTypes).
                          super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                          ._M_impl.super__Vector_impl_data._M_start;
LAB_002f4d81:
                pBVar14[lVar18] = kVariableUb;
              }
            }
            else if ((vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[iVar17] <= 0.0) {
              if ((this->bestVub).
                  super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar18].first == -1) {
                if ((preferVbds) &&
                   ((this->bestVlb).
                    super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar18].first != -1))
                goto LAB_002f4dd3;
                (this->boundTypes).
                super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar18] = kSimpleUb;
              }
              else {
LAB_002f4e3d:
                (this->boundTypes).
                super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar18] = kVariableUb;
              }
            }
            else if ((this->bestVlb).
                     super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar18].first == -1) {
              if ((preferVbds) &&
                 ((this->bestVub).
                  super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar18].first != -1)) goto LAB_002f4e3d;
              (this->boundTypes).
              super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar18] = kSimpleLb;
            }
            else {
LAB_002f4dd3:
              (this->boundTypes).
              super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar18] = kVariableLb;
            }
          }
          else if (((this->bestVlb).
                    super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar18].first == -1) ||
                  (((!preferVbds &&
                    ((vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[iVar17] <= 0.0)) &&
                   ((this->simpleLbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start[lVar18] <= dVar26 + dVar24)))) {
            (this->boundTypes).
            super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar18] = kSimpleLb;
          }
          else {
LAB_002f4d10:
            pBVar14 = (this->boundTypes).
                      super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
LAB_002f4d17:
            pBVar14[lVar18] = kVariableLb;
          }
LAB_002f4e5b:
          pBVar14 = (this->boundTypes).
                    super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          switch(pBVar14[lVar18]) {
          case kSimpleUb:
            pdVar15 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            if (pdVar15[iVar17] < 0.0) {
              dVar20 = (double)local_68 * pdVar15[iVar17];
              dVar22 = local_c8 - dVar20;
              dVar26 = dVar20 + dVar22;
              dVar20 = -dVar20 - (dVar22 - dVar26);
LAB_002f50bf:
              dVar20 = (local_c8 - dVar26) + dVar20;
              pBVar14[lVar18] = BVar2;
              piVar5 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              piVar5[iVar17] = piVar5[(long)iVar13 + -1];
              pdVar15[iVar17] = pdVar15[(long)iVar13 + -1];
              piVar5[(long)iVar13 + -1] = 0;
              pdVar15[(long)iVar13 + -1] = 0.0;
              goto LAB_002f4a02;
            }
            break;
          case kSimpleLb:
            pdVar15 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            if (0.0 < pdVar15[iVar17]) {
              dVar20 = (double)local_98 * pdVar15[iVar17];
              dVar22 = local_c8 - dVar20;
              dVar26 = dVar20 + dVar22;
              dVar20 = -dVar20 - (dVar22 - dVar26);
              goto LAB_002f50bf;
            }
            break;
          case kVariableUb:
            ppVar6 = (this->bestVub).
                     super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            dVar26 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[iVar17];
            dVar22 = ppVar6[lVar18].second.constant * dVar26;
            local_98 = (vector<double,_std::allocator<double>_> *)(local_c8 - dVar22);
            local_b8 = local_b8 +
                       (local_c8 - (dVar22 + (double)local_98)) +
                       (-dVar22 - ((double)local_98 - (dVar22 + (double)local_98)));
            HighsSparseVectorSum::add
                      (local_50,ppVar6[lVar18].first,dVar26 * ppVar6[lVar18].second.coef);
            pdVar15 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            dVar26 = pdVar15[iVar17];
            dVar22 = -dVar26;
            pdVar15[iVar17] = dVar22;
            local_c8 = (double)local_98;
            if (dVar26 < dVar22) {
LAB_002f4f7a:
              (this->boundTypes).
              super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar18] = BVar2;
              dVar20 = (double)(ulong)(iVar13 - 1);
              piVar5 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              piVar5[iVar17] = piVar5[(long)iVar13 + -1];
              pdVar15[iVar17] = pdVar15[(long)iVar13 + -1];
              piVar5[(long)iVar13 + -1] = 0;
              pdVar15[(long)iVar13 + -1] = 0.0;
              bVar11 = false;
              local_c8 = (double)local_98;
              goto LAB_002f4a39;
            }
            break;
          case kVariableLb:
            ppVar6 = (this->bestVlb).
                     super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            dVar26 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[iVar17];
            dVar22 = ppVar6[lVar18].second.constant * dVar26;
            local_98 = (vector<double,_std::allocator<double>_> *)(local_c8 - dVar22);
            local_b8 = local_b8 +
                       (local_c8 - (dVar22 + (double)local_98)) +
                       (-dVar22 - ((double)local_98 - (dVar22 + (double)local_98)));
            HighsSparseVectorSum::add
                      (local_50,ppVar6[lVar18].first,dVar26 * ppVar6[lVar18].second.coef);
            pdVar15 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            local_c8 = (double)local_98;
            if (0.0 < pdVar15[iVar17]) goto LAB_002f4f7a;
          }
          iVar17 = local_88._0_4_ + 1;
          bVar11 = false;
        }
      }
      if (bVar11) {
        return false;
      }
    } while (iVar17 < SUB84(dVar20,0));
  }
  pHVar10 = local_a0;
  iVar17 = SUB84(dVar20,0);
  if ((this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<double,_std::allocator<double>_>::resize(vals,(long)iVar17);
    std::vector<int,_std::allocator<int>_>::resize(inds,(long)iVar17);
  }
  else {
    this_00 = &this->vectorsum;
    local_70 = dVar20;
    if (iVar17 != 0) {
      uVar21 = 0;
      do {
        dVar26 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar21];
        if ((dVar26 != 0.0) || (NAN(dVar26))) {
          HighsSparseVectorSum::add
                    (this_00,(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[uVar21],dVar26);
        }
        uVar21 = uVar21 + 1;
      } while (((ulong)dVar20 & 0xffffffff) != uVar21);
    }
    this_01 = &(this->vectorsum).nonzeroinds;
    piVar5 = (this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar21 = (ulong)((long)(this->vectorsum).nonzeroinds.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar5) >> 2;
    uVar12 = (uint)uVar21;
    if (0 < (int)uVar12) {
      pHVar8 = (this_00->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pHVar9 = pHVar10->options_mip_;
      lVar18 = (ulong)(uVar12 & 0x7fffffff) + 1;
      do {
        iVar17 = piVar5[lVar18 + -2];
        if (ABS(pHVar8[iVar17].hi + pHVar8[iVar17].lo) <=
            (pHVar9->super_HighsOptionsStruct).small_matrix_value) {
          iVar13 = (int)uVar21;
          uVar21 = (ulong)(iVar13 - 1);
          pHVar8[iVar17].hi = 0.0;
          pHVar8[iVar17].lo = 0.0;
          iVar4 = piVar5[(long)iVar13 + -1];
          piVar5[(long)iVar13 + -1] = iVar17;
          piVar5[lVar18 + -2] = iVar4;
        }
        uVar12 = (uint)uVar21;
        lVar18 = lVar18 + -1;
      } while (1 < lVar18);
    }
    std::vector<int,_std::allocator<int>_>::resize(this_01,(long)(int)uVar12);
    local_88 = *(double *)
                ((long)(pHVar10->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x6620);
    if (0.0 <= local_88) {
      std::vector<int,_std::allocator<int>_>::operator=(inds,this_01);
      uVar21 = (ulong)((long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 2;
      local_98 = (vector<double,_std::allocator<double>_> *)(long)(int)uVar21;
      std::vector<double,_std::allocator<double>_>::resize(vals,(size_type)local_98);
      local_70 = (double)uVar21;
      if ((int)local_98 != 0) {
        piVar5 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pHVar8 = (this_00->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar15 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar19 = 0;
        do {
          iVar17 = piVar5[uVar19];
          pdVar15[uVar19] = pHVar8[iVar17].hi + pHVar8[iVar17].lo;
          uVar19 = uVar19 + 1;
        } while ((uVar21 & 0xffffffff) != uVar19);
      }
    }
    HighsSparseVectorSum::clear(this_00);
    dVar20 = local_70;
    if (local_88 < 0.0) {
      return false;
    }
  }
  local_70 = dVar20;
  if (SUB84(dVar20,0) != 0) {
    uVar21 = 0;
    do {
      iVar17 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start[uVar21];
      lVar18 = (long)iVar17;
      if (iVar17 < iVar3) {
        local_88 = *(double *)
                    (*(long *)((long)(local_a0->mipdata_)._M_t.
                                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                     .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x698) +
                    lVar18 * 8);
        local_98 = *(vector<double,_std::allocator<double>_> **)
                    (*(long *)((long)(local_a0->mipdata_)._M_t.
                                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                     .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x6b0) +
                    lVar18 * 8);
      }
      else {
        local_88 = HighsLpRelaxation::slackLower(this->lprelaxation,iVar17 - iVar3);
        local_98 = (vector<double,_std::allocator<double>_> *)
                   HighsLpRelaxation::slackUpper(this->lprelaxation,iVar17 - iVar3);
      }
      bVar11 = HighsLpRelaxation::isColIntegral(this->lprelaxation,iVar17);
      if ((bVar11) &&
         (pBVar14 = (this->boundTypes).
                    super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         (pBVar14[lVar18] & ~kSimpleLb) != kVariableUb)) {
        if (*integersPositive == true) {
          if (local_88 <= -INFINITY) {
            bVar11 = true;
            if ((double)local_98 < INFINITY) goto LAB_002f553e;
          }
          else {
            bVar11 = true;
            if (((double)local_98 < INFINITY) &&
               ((vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar21] <= 0.0)) {
LAB_002f553e:
              bVar11 = false;
            }
          }
        }
        else {
          dVar26 = (this->ubDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar18];
          pdVar1 = (this->lbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar18;
          bVar11 = *pdVar1 <= dVar26 && dVar26 != *pdVar1;
        }
        pBVar14[lVar18] = bVar11;
      }
      uVar21 = uVar21 + 1;
    } while (((ulong)dVar20 & 0xffffffff) != uVar21);
  }
  iVar17 = SUB84(local_70,0);
  std::vector<double,_std::allocator<double>_>::resize(local_40,(long)iVar17);
  std::vector<double,_std::allocator<double>_>::resize(local_48,(long)iVar17);
  if (iVar17 != 0) {
    local_98 = &this->ubDist;
    local_68 = &this->lbDist;
    uVar21 = 0;
    do {
      iVar17 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start[uVar21];
      lVar18 = (long)iVar17;
      if (iVar17 < iVar3) {
        dVar26 = *(double *)
                  (*(long *)((long)(local_a0->mipdata_)._M_t.
                                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                   .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x6b0) +
                  lVar18 * 8);
        dVar22 = *(double *)
                  (*(long *)((long)(local_a0->mipdata_)._M_t.
                                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                   .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x698) +
                  lVar18 * 8);
      }
      else {
        local_88 = HighsLpRelaxation::slackLower(this->lprelaxation,iVar17 - iVar3);
        dVar26 = HighsLpRelaxation::slackUpper(this->lprelaxation,iVar17 - iVar3);
        dVar22 = local_88;
      }
      (local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar21] = dVar26 - dVar22;
      pvVar16 = local_68;
      switch((this->boundTypes).
             super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar18]) {
      case kSimpleUb:
        pdVar15 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        dVar22 = pdVar15[uVar21];
        dVar26 = dVar26 * dVar22;
        dVar24 = local_c8 - dVar26;
        local_b8 = local_b8 +
                   (local_c8 - (dVar26 + dVar24)) + (-dVar26 - (dVar24 - (dVar26 + dVar24)));
        pdVar15[uVar21] = -dVar22;
        pvVar16 = local_98;
        local_c8 = dVar24;
        break;
      case kSimpleLb:
        dVar22 = dVar22 * (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar21];
        dVar26 = local_c8 - dVar22;
        local_b8 = local_b8 +
                   (local_c8 - (dVar22 + dVar26)) + (-dVar22 - (dVar26 - (dVar22 + dVar26)));
        local_c8 = dVar26;
        break;
      case kVariableUb:
        pvVar16 = local_98;
        break;
      case kVariableLb:
        break;
      default:
        goto switchD_002f5656_default;
      }
      (local_48->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar21] =
           (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar18];
switchD_002f5656_default:
      bVar11 = HighsLpRelaxation::isColIntegral(this->lprelaxation,iVar17);
      if (bVar11) {
        if (*integersPositive == true) {
          bVar11 = 0.0 < (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar21];
        }
        else {
          bVar11 = false;
        }
        *integersPositive = bVar11;
      }
      uVar21 = uVar21 + 1;
    } while (((ulong)dVar20 & 0xffffffff) != uVar21);
  }
  *local_38 = local_c8 + local_b8;
  if ((local_70._0_4_ == 0) &&
     (-*(double *)
        ((long)(local_a0->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x6620) <= local_c8 + local_b8)
     ) {
    return false;
  }
  return true;
}

Assistant:

bool HighsTransformedLp::transform(std::vector<double>& vals,
                                   std::vector<double>& upper,
                                   std::vector<double>& solval,
                                   std::vector<HighsInt>& inds, double& rhs,
                                   bool& integersPositive, bool preferVbds) {
  // vector sum should be empty
  assert(vectorsum.getNonzeros().empty());

  HighsCDouble tmpRhs = rhs;

  const HighsMipSolver& mip = lprelaxation.getMipSolver();
  const HighsInt slackOffset = lprelaxation.numCols();

  HighsInt numNz = inds.size();

  auto getLb = [&](HighsInt col) {
    return (col < slackOffset ? mip.mipdata_->domain.col_lower_[col]
                              : lprelaxation.slackLower(col - slackOffset));
  };

  auto getUb = [&](HighsInt col) {
    return (col < slackOffset ? mip.mipdata_->domain.col_upper_[col]
                              : lprelaxation.slackUpper(col - slackOffset));
  };

  auto remove = [&](HighsInt position) {
    numNz--;
    inds[position] = inds[numNz];
    vals[position] = vals[numNz];
    inds[numNz] = 0;
    vals[numNz] = 0;
  };

  HighsInt i = 0;
  while (i < numNz) {
    HighsInt col = inds[i];

    double lb = getLb(col);
    double ub = getUb(col);

    if (ub - lb < mip.options_mip_->small_matrix_value) {
      tmpRhs -= std::min(lb, ub) * vals[i];
      remove(i);
      continue;
    }

    if (lb == -kHighsInf && ub == kHighsInf) {
      vectorsum.clear();
      return false;
    }

    // the code below uses the difference between the column upper and lower
    // bounds as the upper bound for the slack from the variable upper bound
    // constraint (upper[j] = ub - lb) and thus assumes that the variable upper
    // bound constraints are tight. this assumption may not be satisfied when
    // new bound changes were derived during cut generation and, therefore, we
    // tighten the best variable upper bound.
    if (bestVub[col].first != -1 &&
        bestVub[col].second.maxValue() > ub + mip.mipdata_->feastol) {
      bool redundant = false;
      bool infeasible = false;
      mip.mipdata_->implications.cleanupVub(col, bestVub[col].first,
                                            bestVub[col].second, ub, redundant,
                                            infeasible, false);
    }

    // the code below uses the difference between the column upper and lower
    // bounds as the upper bound for the slack from the variable lower bound
    // constraint (upper[j] = ub - lb) and thus assumes that the variable lower
    // bound constraints are tight. this assumption may not be satisfied when
    // new bound changes were derived during cut generation and, therefore, we
    // tighten the best variable lower bound.
    if (bestVlb[col].first != -1 &&
        bestVlb[col].second.minValue() < lb - mip.mipdata_->feastol) {
      bool redundant = false;
      bool infeasible = false;
      mip.mipdata_->implications.cleanupVlb(col, bestVlb[col].first,
                                            bestVlb[col].second, lb, redundant,
                                            infeasible, false);
    }

    // store the old bound type so that we can restore it if the continuous
    // column is relaxed out anyways. This allows to correctly transform and
    // then untransform multiple base rows which is useful to compute cuts based
    // on several transformed base rows. It could otherwise lead to bugs if a
    // column is first transformed with a simple bound and not relaxed but for
    // another base row is transformed and relaxed with a variable bound. Should
    // the non-relaxed column now be untransformed we would wrongly use the
    // variable bound even though this is not the correct way to untransform the
    // column.
    BoundType oldBoundType = boundTypes[col];

    if (lprelaxation.isColIntegral(col)) {
      if (ub - lb <= 1.5 || boundDist[col] != 0.0 || simpleLbDist[col] == 0 ||
          simpleUbDist[col] == 0) {
        // since we skip the handling of variable bound constraints for all
        // binary and some general-integer variables here, the bound type used
        // should be a simple lower or upper bound
        if (simpleLbDist[col] < simpleUbDist[col] - mip.mipdata_->feastol) {
          boundTypes[col] = BoundType::kSimpleLb;
        } else if (simpleUbDist[col] <
                   simpleLbDist[col] - mip.mipdata_->feastol) {
          boundTypes[col] = BoundType::kSimpleUb;
        } else if (vals[i] > 0) {
          boundTypes[col] = BoundType::kSimpleLb;
        } else {
          boundTypes[col] = BoundType::kSimpleUb;
        }
        i++;
        continue;
      }
      if (bestVlb[col].first == -1 ||
          ubDist[col] < lbDist[col] - mip.mipdata_->feastol) {
        assert(bestVub[col].first != -1);
        boundTypes[col] = BoundType::kVariableUb;
      } else if (bestVub[col].first == -1 ||
                 lbDist[col] < ubDist[col] - mip.mipdata_->feastol) {
        assert(bestVlb[col].first != -1);
        boundTypes[col] = BoundType::kVariableLb;
      } else if (vals[i] > 0) {
        assert(bestVub[col].first != -1);
        boundTypes[col] = BoundType::kVariableUb;
      } else {
        assert(bestVlb[col].first != -1);
        boundTypes[col] = BoundType::kVariableLb;
      }
    } else {
      if (lbDist[col] < ubDist[col] - mip.mipdata_->feastol) {
        if (bestVlb[col].first == -1)
          boundTypes[col] = BoundType::kSimpleLb;
        else if (preferVbds || vals[i] > 0 ||
                 simpleLbDist[col] > lbDist[col] + mip.mipdata_->feastol)
          boundTypes[col] = BoundType::kVariableLb;
        else
          boundTypes[col] = BoundType::kSimpleLb;
      } else if (ubDist[col] < lbDist[col] - mip.mipdata_->feastol) {
        if (bestVub[col].first == -1)
          boundTypes[col] = BoundType::kSimpleUb;
        else if (preferVbds || vals[i] < 0 ||
                 simpleUbDist[col] > ubDist[col] + mip.mipdata_->feastol)
          boundTypes[col] = BoundType::kVariableUb;
        else
          boundTypes[col] = BoundType::kSimpleUb;
      } else if (vals[i] > 0) {
        if (bestVlb[col].first != -1)
          boundTypes[col] = BoundType::kVariableLb;
        else if (preferVbds && bestVub[col].first != -1)
          boundTypes[col] = BoundType::kVariableUb;
        else
          boundTypes[col] = BoundType::kSimpleLb;
      } else {
        if (bestVub[col].first != -1)
          boundTypes[col] = BoundType::kVariableUb;
        else if (preferVbds && bestVlb[col].first != -1)
          boundTypes[col] = BoundType::kVariableLb;
        else
          boundTypes[col] = BoundType::kSimpleUb;
      }
    }

    switch (boundTypes[col]) {
      case BoundType::kSimpleLb:
        if (vals[i] > 0) {
          // relax away using lower bound
          tmpRhs -= lb * vals[i];
          boundTypes[col] = oldBoundType;
          remove(i);
          continue;
        }
        break;
      case BoundType::kSimpleUb:
        if (vals[i] < 0) {
          // relax away using upper bound
          tmpRhs -= ub * vals[i];
          boundTypes[col] = oldBoundType;
          remove(i);
          continue;
        }
        break;
      case BoundType::kVariableLb:
        tmpRhs -= bestVlb[col].second.constant * vals[i];
        vectorsum.add(bestVlb[col].first, vals[i] * bestVlb[col].second.coef);
        if (vals[i] > 0) {
          boundTypes[col] = oldBoundType;
          remove(i);
          continue;
        }
        break;
      case BoundType::kVariableUb:
        tmpRhs -= bestVub[col].second.constant * vals[i];
        vectorsum.add(bestVub[col].first, vals[i] * bestVub[col].second.coef);
        vals[i] = -vals[i];
        if (vals[i] > 0) {
          boundTypes[col] = oldBoundType;
          remove(i);
          continue;
        }
    }
    // move to next element
    i++;
  }

  if (!vectorsum.getNonzeros().empty()) {
    for (HighsInt i = 0; i != numNz; ++i) {
      if (vals[i] != 0.0) vectorsum.add(inds[i], vals[i]);
    }

    double maxError = 0.0;
    auto IsZero = [&](HighsInt col, double val) {
      if (std::abs(val) <= mip.options_mip_->small_matrix_value) return true;
      return false;
    };

    vectorsum.cleanup(IsZero);
    if (maxError > mip.mipdata_->feastol) {
      vectorsum.clear();
      return false;
    }

    inds = vectorsum.getNonzeros();
    numNz = inds.size();

    vals.resize(numNz);
    for (HighsInt j = 0; j != numNz; ++j) vals[j] = vectorsum.getValue(inds[j]);

    vectorsum.clear();
  } else {
    vals.resize(numNz);
    inds.resize(numNz);
  }

  for (HighsInt j = 0; j != numNz; ++j) {
    HighsInt col = inds[j];

    // get bounds
    double lb = getLb(col);
    double ub = getUb(col);

    // variable should not be free
    assert(lb != -kHighsInf || ub != kHighsInf);

    // set bound type for previously unprocessed integer-constrained variables
    if (!lprelaxation.isColIntegral(col)) continue;

    // do not overwrite bound type for integral slacks from vlb / vub
    // constraints
    if (boundTypes[col] == BoundType::kVariableLb ||
        boundTypes[col] == BoundType::kVariableUb)
      continue;

    // complement integers to make coefficients positive if both bounds are
    // finite; otherwise, complement integers with closest bound.
    // take into account 'integersPositive' provided by caller.
    if (integersPositive) {
      if ((lb != -kHighsInf && vals[j] > 0) || ub == kHighsInf)
        boundTypes[col] = BoundType::kSimpleLb;
      else
        boundTypes[col] = BoundType::kSimpleUb;
    } else {
      if (lbDist[col] < ubDist[col])
        boundTypes[col] = BoundType::kSimpleLb;
      else
        boundTypes[col] = BoundType::kSimpleUb;
    }
  }

  upper.resize(numNz);
  solval.resize(numNz);

  for (HighsInt j = 0; j != numNz; ++j) {
    HighsInt col = inds[j];

    double lb = getLb(col);
    double ub = getUb(col);

    upper[j] = ub - lb;

    switch (boundTypes[col]) {
      case BoundType::kSimpleLb: {
        // shift (lower bound)
        assert(lb != -kHighsInf);
        tmpRhs -= lb * vals[j];
        solval[j] = lbDist[col];
        break;
      }
      case BoundType::kSimpleUb: {
        // complement (upper bound)
        assert(ub != kHighsInf);
        tmpRhs -= ub * vals[j];
        vals[j] = -vals[j];
        solval[j] = ubDist[col];
        break;
      }
      case BoundType::kVariableLb: {
        solval[j] = lbDist[col];
        break;
      }
      case BoundType::kVariableUb: {
        solval[j] = ubDist[col];
        break;
      }
    }

    // check if all integer-constrained variables have positive coefficients
    if (lprelaxation.isColIntegral(col))
      integersPositive = integersPositive && vals[j] > 0;
  }

  rhs = double(tmpRhs);

  if (numNz == 0 && rhs >= -mip.mipdata_->feastol) return false;

  return true;
}